

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
* toml::detail::parse_key<toml::type_config>(location *loc,context<toml::type_config> *ctx)

{
  bool bVar1;
  context<toml::type_config> *in_RDX;
  result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
  *in_RDI;
  source_location src;
  region reg;
  result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
  key;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  spec *spec;
  location first;
  source_location *in_stack_fffffffffffffa18;
  failure_type *f;
  result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
  *in_stack_fffffffffffffa20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa30;
  int in_stack_fffffffffffffa34;
  location *in_stack_fffffffffffffa38;
  error_type *in_stack_fffffffffffffa40;
  result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
  *this;
  char *in_stack_fffffffffffffa58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa60;
  result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
  *in_stack_fffffffffffffa78;
  source_location in_stack_fffffffffffffa80;
  location *in_stack_fffffffffffffa88;
  region *in_stack_fffffffffffffa90;
  region *in_stack_fffffffffffffa98;
  source_location *in_stack_fffffffffffffaa0;
  pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
  *in_stack_fffffffffffffaa8;
  location *in_stack_fffffffffffffb10;
  sequence *in_stack_fffffffffffffb18;
  allocator<char> local_439 [17];
  undefined8 in_stack_fffffffffffffbd8;
  undefined8 in_stack_fffffffffffffbe0;
  undefined8 in_stack_fffffffffffffbe8;
  allocator<char> local_399 [121];
  failure_type local_320 [5];
  undefined **local_160;
  int local_154;
  undefined **local_150;
  context<toml::type_config> *in_stack_ffffffffffffff10;
  location *in_stack_ffffffffffffff18;
  result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
  local_e0;
  spec *local_68;
  context<toml::type_config> *local_18;
  
  this = in_RDI;
  local_18 = in_RDX;
  location::location((location *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  local_68 = context<toml::type_config>::toml_spec(local_18);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x7209a3);
  do {
    bVar1 = location::eof((location *)in_stack_fffffffffffffa20);
    if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_00720bd5;
    parse_simple_key<toml::type_config>(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    bVar1 = result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
            ::is_ok(&local_e0);
    if (bVar1) {
      local_160 = &PTR_s__workspace_llm4binary_github_lic_00a5eef0;
      result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
      ::unwrap(in_stack_fffffffffffffa78,in_stack_fffffffffffffa80);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffa20,(value_type *)in_stack_fffffffffffffa18);
      syntax::dot_sep((spec *)in_stack_fffffffffffffa78);
      sequence::scan(in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
      sequence::~sequence((sequence *)in_stack_fffffffffffffa20);
      bVar1 = region::is_ok((region *)0x720b46);
      if (bVar1) {
        local_154 = 0;
      }
      else {
        local_154 = 3;
      }
      region::~region((region *)in_stack_fffffffffffffa20);
    }
    else {
      local_150 = &PTR_s__workspace_llm4binary_github_lic_00a5eed8;
      in_stack_fffffffffffffa40 =
           result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
           ::unwrap_err(in_stack_fffffffffffffa78,in_stack_fffffffffffffa80);
      err<toml::error_info&>((error_info *)in_stack_fffffffffffffa78);
      result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
      ::result(in_stack_fffffffffffffa20,(failure_type *)in_stack_fffffffffffffa18);
      failure<toml::error_info>::~failure((failure<toml::error_info> *)0x720a4f);
      local_154 = 1;
    }
    result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
    ::~result((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
               *)0x720b9f);
    in_stack_fffffffffffffa34 = local_154;
  } while (local_154 == 0);
  if (local_154 == 3) {
LAB_00720bd5:
    bVar1 = CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
    if (bVar1) {
      region::region(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
      source_location::source_location(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
      region::~region((region *)in_stack_fffffffffffffa20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,(allocator<char> *)this);
      source_location::source_location
                ((source_location *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
      in_stack_fffffffffffffa20 =
           (result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
            *)local_439;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,(allocator<char> *)this);
      make_error_info<>((string *)in_stack_fffffffffffffbe8,
                        (source_location *)in_stack_fffffffffffffbe0,
                        (string *)in_stack_fffffffffffffbd8);
      f = local_320;
      err<toml::error_info>((error_info *)in_stack_fffffffffffffa78);
      result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
      ::result(in_stack_fffffffffffffa20,f);
      failure<toml::error_info>::~failure((failure<toml::error_info> *)0x720cf2);
      error_info::~error_info((error_info *)in_stack_fffffffffffffa20);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa20);
      std::allocator<char>::~allocator(local_439);
      source_location::~source_location((source_location *)in_stack_fffffffffffffa20);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa20);
      std::allocator<char>::~allocator(local_399);
      local_154 = 1;
      source_location::~source_location((source_location *)in_stack_fffffffffffffa20);
    }
    else {
      region::region((region *)this,(location *)in_RDI,(location *)in_stack_fffffffffffffa40);
      std::
      make_pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,toml::detail::region>
                (in_stack_fffffffffffffa28,(region *)in_stack_fffffffffffffa20);
      ok<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,toml::detail::region>>
                (in_stack_fffffffffffffaa8);
      result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
      ::result(in_stack_fffffffffffffa20,(success_type *)in_stack_fffffffffffffa18);
      success<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>_>
      ::~success((success<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>_>
                  *)0x720eb9);
      std::
      pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
      ::~pair((pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
               *)in_stack_fffffffffffffa20);
      region::~region((region *)in_stack_fffffffffffffa20);
      local_154 = 1;
    }
  }
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
  location::~location((location *)in_stack_fffffffffffffa20);
  return this;
}

Assistant:

result<std::pair<std::vector<typename basic_value<TC>::key_type>, region>, error_info>
parse_key(location& loc, const context<TC>& ctx)
{
    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    using key_type = typename basic_value<TC>::key_type;
    std::vector<key_type> keys;
    while( ! loc.eof())
    {
        auto key = parse_simple_key(loc, ctx);
        if( ! key.is_ok())
        {
            return err(key.unwrap_err());
        }
        keys.push_back(std::move(key.unwrap()));

        auto reg = syntax::dot_sep(spec).scan(loc);
        if( ! reg.is_ok())
        {
            break;
        }
    }
    if(keys.empty())
    {
        auto src = source_location(region(first));
        return err(make_error_info("toml::parse_key: expected a new key, "
                    "but got nothing", std::move(src), "reached EOF"));
    }

    return ok(std::make_pair(std::move(keys), region(first, loc)));
}